

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.cpp
# Opt level: O3

ssize_t __thiscall
stream::slice_reader::read(slice_reader *this,int __fd,void *__buf,size_t __nbytes)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  long *plVar4;
  ulong uVar5;
  void *pvVar6;
  undefined4 in_register_00000034;
  ulong uVar7;
  long lVar8;
  
  lVar8 = CONCAT44(in_register_00000034,__fd);
  seek(this,this->current_slice);
  if ((long)__buf < 1) {
    uVar7 = 0;
  }
  else {
    uVar7 = 0;
    pvVar6 = __buf;
    do {
      uVar3 = std::istream::tellg();
      if (this->slice_size < uVar3) {
LAB_0014f101:
        __buf = (void *)0x1;
        break;
      }
      if (this->slice_size == uVar3) {
        seek(this,this->current_slice + 1);
        uVar3 = std::istream::tellg();
        if (this->slice_size < uVar3) goto LAB_0014f101;
      }
      plVar4 = (long *)std::istream::read((char *)this->is,lVar8);
      if ((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) != 0) goto LAB_0014f101;
      lVar1 = this->is->_M_gcount;
      uVar7 = uVar7 + lVar1;
      lVar8 = lVar8 + lVar1;
      __buf = (void *)((long)pvVar6 - lVar1);
      bVar2 = lVar1 <= (long)pvVar6;
      pvVar6 = __buf;
    } while (__buf != (void *)0x0 && bVar2);
  }
  uVar5 = -(ulong)(uVar7 == 0) | uVar7;
  if (__buf == (void *)0x0) {
    uVar5 = uVar7;
  }
  return uVar5;
}

Assistant:

std::streamsize slice_reader::read(char * buffer, std::streamsize bytes) {
	
	seek(current_slice);
	
	std::streamsize nread = 0;
	
	while(bytes > 0) {
		
		boost::uint32_t read_pos = boost::uint32_t(is->tellg());
		if(read_pos > slice_size) {
			break;
		}
		boost::uint32_t remaining = slice_size - read_pos;
		if(!remaining) {
			seek(current_slice + 1);
			read_pos = boost::uint32_t(is->tellg());
			if(read_pos > slice_size) {
				break;
			}
			remaining = slice_size - read_pos;
		}
		
		boost::uint64_t toread = std::min(boost::uint64_t(remaining), boost::uint64_t(bytes));
		toread = std::min(toread, boost::uint64_t(std::numeric_limits<std::streamsize>::max()));
		if(is->read(buffer, std::streamsize(toread)).fail()) {
			break;
		}
		
		std::streamsize read = is->gcount();
		nread += read, buffer += read, bytes -= read;
	}
	
	return (nread != 0 || bytes == 0) ? nread : -1;
}